

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::SetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,LayeredTextureMap *layeredTextures,
          MeshGeometry *mesh)

{
  MeshGeometry *pMVar1;
  LayeredTextureMap *pLVar2;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  MeshGeometry *local_28;
  MeshGeometry *mesh_local;
  LayeredTextureMap *layeredTextures_local;
  aiMaterial *out_mat_local;
  FBXConverter *this_local;
  
  local_28 = mesh;
  mesh_local = (MeshGeometry *)layeredTextures;
  layeredTextures_local = (LayeredTextureMap *)out_mat;
  out_mat_local = (aiMaterial *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"DiffuseColor",&local_49);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_48,aiTextureType_DIFFUSE,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"AmbientColor",&local_81);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_80,aiTextureType_AMBIENT,
             local_28);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"EmissiveColor",&local_a9);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_a8,aiTextureType_EMISSIVE,
             local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"SpecularColor",&local_d1);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_d0,aiTextureType_SPECULAR,
             local_28);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"SpecularFactor",&local_f9);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_f8,aiTextureType_SPECULAR,
             local_28);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"TransparentColor",&local_121);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_120,aiTextureType_OPACITY,
             local_28);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"ReflectionColor",&local_149);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_148,
             aiTextureType_REFLECTION,local_28);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"DisplacementColor",&local_171);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_170,
             aiTextureType_DISPLACEMENT,local_28);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"NormalMap",&local_199);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_198,aiTextureType_NORMALS,
             local_28);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"Bump",&local_1c1);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_1c0,aiTextureType_HEIGHT,
             local_28);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"ShininessExponent",&local_1e9);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_1e8,
             aiTextureType_SHININESS,local_28);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"EmissiveFactor",&local_211);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_210,aiTextureType_EMISSIVE
             ,local_28);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  pLVar2 = layeredTextures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"TransparencyFactor",&local_239);
  TrySetTextureProperties
            (this,(aiMaterial *)pLVar2,(LayeredTextureMap *)pMVar1,&local_238,aiTextureType_OPACITY,
             local_28);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  return;
}

Assistant:

void FBXConverter::SetTextureProperties(aiMaterial* out_mat, const LayeredTextureMap& layeredTextures, const MeshGeometry* const mesh)
        {
            TrySetTextureProperties(out_mat, layeredTextures, "DiffuseColor", aiTextureType_DIFFUSE, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "AmbientColor", aiTextureType_AMBIENT, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "EmissiveColor", aiTextureType_EMISSIVE, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "SpecularColor", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "SpecularFactor", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "TransparentColor", aiTextureType_OPACITY, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "ReflectionColor", aiTextureType_REFLECTION, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "DisplacementColor", aiTextureType_DISPLACEMENT, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "NormalMap", aiTextureType_NORMALS, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "Bump", aiTextureType_HEIGHT, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "ShininessExponent", aiTextureType_SHININESS, mesh);
			TrySetTextureProperties( out_mat, layeredTextures, "EmissiveFactor", aiTextureType_EMISSIVE, mesh );
			TrySetTextureProperties( out_mat, layeredTextures, "TransparencyFactor", aiTextureType_OPACITY, mesh );
        }